

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  pointer pQVar2;
  ostream *poVar3;
  ulong uVar4;
  ANNpoint pAVar5;
  long lVar6;
  int j;
  undefined8 uVar7;
  int i;
  ulong uVar8;
  bool bVar9;
  void **local_4e8 [16];
  undefined1 local_468 [128];
  int *local_3e8 [16];
  int local_368 [16];
  ANNpoint local_328 [16];
  double local_2a8 [15];
  undefined1 *puStack_230;
  undefined1 local_228 [8];
  MultiANN MAG;
  int topology [4];
  string local_c0;
  size_type *local_a0;
  string filename;
  vector<Quaternion,_std::allocator<Quaternion>_> cloud;
  vector<double_*,_std::allocator<double_*>_> pointers_to_points;
  ANNpoint pAStack_48;
  int idx_ann;
  double d_ann;
  ANNpoint query_pt;
  
  local_a0 = &filename._M_string_length;
  filename._M_dataplus._M_p = (pointer)0x0;
  filename._M_string_length._0_1_ = 0;
  if (argc == 2) {
    puStack_230 = (undefined1 *)0x104aab;
    std::__cxx11::string::string((string *)local_228,argv[1],(allocator *)(topology + 2));
  }
  else {
    if (argc != 1) {
      puStack_230 = (undefined1 *)0x104e95;
      poVar3 = std::operator<<((ostream *)&std::cout,"Wrong number of arguments!");
      puStack_230 = (undefined1 *)0x104e9d;
      std::endl<char,std::char_traits<char>>(poVar3);
      puStack_230 = &LAB_00104ea5;
      exit(1);
    }
    puStack_230 = (undefined1 *)0x104a70;
    poVar3 = std::operator<<((ostream *)&std::cout,"Loading the quaternion file from disk...");
    puStack_230 = (undefined1 *)0x104a78;
    std::endl<char,std::char_traits<char>>(poVar3);
    puStack_230 = (undefined1 *)0x104a92;
    std::__cxx11::string::string((string *)local_228,"simple_0.qua",(allocator *)(topology + 2));
  }
  puStack_230 = (undefined1 *)0x104ac1;
  std::__cxx11::string::operator=((string *)&local_a0,(string *)local_228);
  puStack_230 = (undefined1 *)0x104ac9;
  std::__cxx11::string::~string((string *)local_228);
  puStack_230 = (undefined1 *)0x104adc;
  std::__cxx11::string::string((string *)&local_c0,(string *)&local_a0);
  puStack_230 = (undefined1 *)0x104aec;
  load_quaternion_cloud
            ((vector<Quaternion,_std::allocator<Quaternion>_> *)((long)&filename.field_2 + 8),
             &local_c0);
  puStack_230 = (undefined1 *)0x104af8;
  std::__cxx11::string::~string((string *)&local_c0);
  uVar4 = (ulong)((long)cloud.super__Vector_base<Quaternion,_std::allocator<Quaternion>_>._M_impl.
                        super__Vector_impl_data._M_start - filename.field_2._8_8_) >> 5;
  pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cloud.super__Vector_base<Quaternion,_std::allocator<Quaternion>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uVar8 = 0;
  if (0 < (int)uVar4) {
    uVar8 = uVar4 & 0xffffffff;
  }
  uVar7 = filename.field_2._8_8_;
  uVar4 = uVar8;
  while (pQVar2 = cloud.super__Vector_base<Quaternion,_std::allocator<Quaternion>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage, bVar9 = uVar4 != 0, uVar4 = uVar4 - 1,
        bVar9) {
    puStack_230 = (undefined1 *)0x104b43;
    local_228 = (undefined1  [8])uVar7;
    std::vector<double*,std::allocator<double*>>::emplace_back<double*>
              ((vector<double*,std::allocator<double*>> *)
               &cloud.super__Vector_base<Quaternion,_std::allocator<Quaternion>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(double **)local_228);
    uVar7 = uVar7 + 0x20;
  }
  puStack_230 = (undefined1 *)0x104b60;
  poVar3 = std::operator<<((ostream *)&std::cout,"Creating the search data structure...");
  puStack_230 = (undefined1 *)0x104b68;
  std::endl<char,std::char_traits<char>>(poVar3);
  MAG.AnnArray[0x1e] = (ANN *)0x300000003;
  topology[0] = 3;
  topology[1] = 3;
  topology[2] = 0;
  topology[3] = 0x3ff00000;
  puStack_230 = (undefined1 *)0x104ba5;
  MultiANN::MultiANN((MultiANN *)local_228,4,0x10,(int *)(MAG.AnnArray + 0x1e),
                     (ANNpoint)(topology + 2));
  for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    puStack_230 = (undefined1 *)0x104bc3;
    MultiANN::AddPoint((MultiANN *)local_228,(ANNpoint)pQVar2->p[uVar4],(ANNpoint)pQVar2->p[uVar4]);
  }
  puStack_230 = (undefined1 *)0x104bdb;
  poVar3 = std::operator<<((ostream *)&std::cout,"Generating Random Query Point");
  puStack_230 = (undefined1 *)0x104be3;
  std::endl<char,std::char_traits<char>>(poVar3);
  puStack_230 = (undefined1 *)0x104bef;
  d_ann = (double)annAllocPt(4,0.0);
  *(ANNcoord *)((long)d_ann + 0x10) = 0.0;
  *(ANNcoord *)d_ann = 0.0;
  *(ANNcoord *)((long)d_ann + 8) = 0.0;
  *(ANNcoord *)((long)d_ann + 0x18) = 1.0;
  puStack_230 = (undefined1 *)0x104c21;
  poVar3 = std::operator<<((ostream *)&std::cout,"Calling single point nearest neighbor...");
  puStack_230 = (undefined1 *)0x104c29;
  std::endl<char,std::char_traits<char>>(poVar3);
  pAStack_48 = (ANNpoint)0x7ff0000000000000;
  puStack_230 = (undefined1 *)0x104c4e;
  pAVar5 = (ANNpoint)
           MultiANN::NearestNeighbor
                     ((MultiANN *)local_228,(ANNpoint *)&d_ann,
                      (int *)((long)&pointers_to_points.
                                     super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage + 4),
                      (double *)&stack0xffffffffffffffb8);
  puStack_230 = (undefined1 *)0x104c64;
  poVar3 = std::operator<<((ostream *)&std::cout,"query_pt = ");
  puStack_230 = (undefined1 *)0x104c73;
  printPt(poVar3,(ANNpoint)d_ann,4);
  puStack_230 = (undefined1 *)0x104c86;
  poVar3 = std::operator<<((ostream *)&std::cout,"result_pt = ");
  puStack_230 = (undefined1 *)0x104c94;
  printPt(poVar3,pAVar5,4);
  puStack_230 = (undefined1 *)0x104ca7;
  std::operator<<((ostream *)&std::cout,"ANN distance = ");
  puStack_230 = (undefined1 *)0x104cb4;
  poVar3 = std::ostream::_M_insert<double>((double)pAStack_48);
  puStack_230 = (undefined1 *)0x104cc3;
  poVar3 = std::operator<<(poVar3," rad");
  puStack_230 = (undefined1 *)0x104ccb;
  std::endl<char,std::char_traits<char>>(poVar3);
  query_pt = pAStack_48;
  puStack_230 = (undefined1 *)0x104ce8;
  std::operator<<((ostream *)&std::cout,"ANN distance = ");
  puStack_230 = (undefined1 *)0x104d05;
  poVar3 = std::ostream::_M_insert<double>(((double)query_pt * 180.0) / 3.141592653589793);
  puStack_230 = (undefined1 *)0x104d14;
  poVar3 = std::operator<<(poVar3," degrees");
  puStack_230 = (undefined1 *)0x104d1c;
  std::endl<char,std::char_traits<char>>(poVar3);
  puStack_230 = (undefined1 *)0x104d2f;
  poVar3 = std::operator<<((ostream *)&std::cout,"Calling multiple point nearest neighbor...");
  puStack_230 = (undefined1 *)0x104d37;
  std::endl<char,std::char_traits<char>>(poVar3);
  for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 8) {
    *(long *)((long)local_328 + lVar6) = (long)local_2a8 + lVar6;
  }
  for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 4) {
    *(long *)((long)local_3e8 + lVar6 * 2) = (long)local_368 + lVar6;
  }
  for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 8) {
    *(undefined1 **)((long)local_4e8 + lVar6) = local_468 + lVar6;
  }
  query_pt = (ANNpoint)local_228;
  MultiANN::NearestNeighbor((MultiANN *)local_228,(ANNpoint *)&d_ann,local_328,local_3e8,local_4e8);
  poVar3 = std::operator<<((ostream *)&std::cout,"Nearest Neighbors:");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (lVar6 = 0; pAVar5 = query_pt, lVar6 != 0x10; lVar6 = lVar6 + 1) {
    iVar1 = local_368[lVar6];
    poVar3 = std::ostream::_M_insert<double>((local_2a8[lVar6] * 180.0) / 3.141592653589793);
    std::operator<<(poVar3," deg: ");
    printPt((ostream *)&std::cout,
            (ANNpoint)
            (cloud.super__Vector_base<Quaternion,_std::allocator<Quaternion>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage)->p[iVar1],4);
  }
  query_pt[-1] = 5.27971888918394e-318;
  MultiANN::~MultiANN((MultiANN *)local_228);
  pAVar5[-1] = 5.27976335509206e-318;
  std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base
            ((_Vector_base<double_*,_std::allocator<double_*>_> *)
             &cloud.super__Vector_base<Quaternion,_std::allocator<Quaternion>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pAVar5[-1] = 5.27980782100019e-318;
  std::_Vector_base<Quaternion,_std::allocator<Quaternion>_>::~_Vector_base
            ((_Vector_base<Quaternion,_std::allocator<Quaternion>_> *)((long)&filename.field_2 + 8))
  ;
  pAVar5[-1] = 5.27986710887769e-318;
  std::__cxx11::string::~string((string *)&local_a0);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    string filename;
    switch (argc) {
        case 1:
            cout << "Loading the quaternion file from disk..." << endl;
            filename = string("simple_0.qua");
            break;
        case 2:
            filename = string(argv[1]);
            break;
        default:
            cout << "Wrong number of arguments!" << endl;
            exit(EXIT_FAILURE);
    }
    auto cloud = load_quaternion_cloud(filename);

    int max_points = cloud.size();      // maximum number of data points
    int dimension = 4;            
    ANNpoint first_point = &(cloud[0].p[0]); 
    vector<double*> pointers_to_points;
    // ANN requires an entire vector of pointers even if the array is dense!
    for (int i = 0; i < max_points; i++) {
        pointers_to_points.push_back(first_point + 4*i);
    }
    ANNpointArray data_points = &pointers_to_points[0]; 

    cout << "Creating the search data structure..." << endl;
    int topology[] = {3, 3, 3, 3}; // Code for a single quaternion
    double _scale = 1.0;
    double scale[] = {_scale, _scale, _scale, _scale};
    int MaxNeighbors = 16;  // number of nearest neighbors
    MultiANN MAG(dimension, MaxNeighbors, topology, scale);
    for (int j = 0; j < max_points; j++) {
      MAG.AddPoint(data_points[j], data_points[j]);  
    }

    cout << "Generating Random Query Point" << endl;
    ANNpoint query_pt = annAllocPt(dimension);          // allocate query point
    //randomDistPoint(dimension, topology, query_pt);
    query_pt[0] = 0.0;
    query_pt[1] = 0.0;
    query_pt[2] = 0.0;
    query_pt[3] = 1.0;

    {
        cout << "Calling single point nearest neighbor..." << endl;
        double d_ann = INFINITY;
        int idx_ann;
        auto result_pt = (ANNpoint)MAG.NearestNeighbor(
            query_pt, idx_ann, d_ann);  // single nearest neighbor
        printPt(cout << "query_pt = ", query_pt, dimension);
        printPt(cout << "result_pt = ", result_pt, dimension);
        cout << "ANN distance = " << d_ann << " rad" << endl;
        double d_degrees = d_ann * 180.0 / PI;
        cout << "ANN distance = " << d_degrees << " degrees" << endl;
    }
    {
        cout << "Calling multiple point nearest neighbor..." << endl;
        double d_ann = INFINITY;

        double best_dist[MaxNeighbors];
        ANNpoint p_best_dist[MaxNeighbors];
        for(int i=0; i<MaxNeighbors; i++) p_best_dist[i] = best_dist+i;

        int best_neighbor_indeces[MaxNeighbors];
        int* p_best_neighbor_indeces[MaxNeighbors];
        for(int i=0; i<MaxNeighbors; i++) p_best_neighbor_indeces[i] = best_neighbor_indeces+i;
        void *best_ptr[MaxNeighbors];
        void **p_best_ptr[MaxNeighbors];
        for(int i=0; i<MaxNeighbors; i++) p_best_ptr[i] = best_ptr+i;
        MAG.NearestNeighbor(query_pt, p_best_dist[0], p_best_neighbor_indeces[0],
                            p_best_ptr[0]);  // multiple nearest neighbor

        cout << "Nearest Neighbors:" << endl;
        for(int i=0; i<MaxNeighbors; i++)
        {
          int best_neighbor_index = best_neighbor_indeces[i];
          //cout << "best_neighbor_index = " << best_neighbor_index << endl;
          cout << best_dist[i]*180.0/PI << " deg: ";
          printPt(cout, pointers_to_points[best_neighbor_index], dimension);
        }

    }
}